

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

void __thiscall
MemoryLeakDetector::
removeMemoryLeakInformationWithoutCheckingOrDeallocatingTheMemoryButDeallocatingTheAccountInformation
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,void *memory,
          bool allocatNodesSeperately)

{
  MemoryLeakDetectorNode *pMVar1;
  undefined7 in_register_00000009;
  
  pMVar1 = MemoryLeakDetectorTable::removeNode(&this->memoryTable_,(char *)memory);
  if ((int)CONCAT71(in_register_00000009,allocatNodesSeperately) != 0) {
    (*allocator->_vptr_TestMemoryAllocator[9])(allocator,pMVar1);
    return;
  }
  return;
}

Assistant:

void MemoryLeakDetector::removeMemoryLeakInformationWithoutCheckingOrDeallocatingTheMemoryButDeallocatingTheAccountInformation(TestMemoryAllocator* allocator, void* memory, bool allocatNodesSeperately)
{
    MemoryLeakDetectorNode* node = memoryTable_.removeNode((char*) memory);
    if (allocatNodesSeperately) allocator->freeMemoryLeakNode( (char*) node);
}